

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTempDatabase(Parse *pParse)

{
  int iVar1;
  Btree *local_30;
  Btree *pBt;
  sqlite3 *psStack_20;
  int rc;
  sqlite3 *db;
  Parse *pParse_local;
  
  psStack_20 = pParse->db;
  if ((psStack_20->aDb[1].pBt == (Btree *)0x0) && (pParse->explain == '\0')) {
    db = (sqlite3 *)pParse;
    pBt._4_4_ = sqlite3BtreeOpen(psStack_20->pVfs,(char *)0x0,psStack_20,&local_30,0,0x21e);
    if (pBt._4_4_ != 0) {
      sqlite3ErrorMsg((Parse *)db,
                      "unable to open a temporary database file for storing temporary tables");
      *(int *)&db->mutex = pBt._4_4_;
      return 1;
    }
    psStack_20->aDb[1].pBt = local_30;
    iVar1 = sqlite3BtreeSetPageSize(local_30,psStack_20->nextPagesize,-1,0);
    if (iVar1 == 7) {
      sqlite3OomFault(psStack_20);
      return 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTempDatabase(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt==0 && !pParse->explain ){
    int rc;
    Btree *pBt;
    static const int flags = 
          SQLITE_OPEN_READWRITE |
          SQLITE_OPEN_CREATE |
          SQLITE_OPEN_EXCLUSIVE |
          SQLITE_OPEN_DELETEONCLOSE |
          SQLITE_OPEN_TEMP_DB;

    rc = sqlite3BtreeOpen(db->pVfs, 0, db, &pBt, 0, flags);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorMsg(pParse, "unable to open a temporary database "
        "file for storing temporary tables");
      pParse->rc = rc;
      return 1;
    }
    db->aDb[1].pBt = pBt;
    assert( db->aDb[1].pSchema );
    if( SQLITE_NOMEM==sqlite3BtreeSetPageSize(pBt, db->nextPagesize, -1, 0) ){
      sqlite3OomFault(db);
      return 1;
    }
  }
  return 0;
}